

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitCallRef(PrintExpressionContents *this,CallRef *curr)

{
  ostream *stream;
  HeapType type;
  char *pcVar1;
  long lVar2;
  bool bVar3;
  
  stream = this->o;
  pcVar1 = "call_ref ";
  bVar3 = curr->isReturn != false;
  if (bVar3) {
    pcVar1 = "return_call_ref ";
  }
  lVar2 = 9;
  if (bVar3) {
    lVar2 = 0x10;
  }
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,lVar2);
  Colors::outputColorCode(stream,"\x1b[0m");
  type = wasm::Type::getHeapType(&curr->target->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    printMedium(o, curr->isReturn ? "return_call_ref " : "call_ref ");
    printHeapTypeName(curr->target->type.getHeapType());
  }